

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableSize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableSize *curr)

{
  char **__return_storage_ptr___00;
  ExternalInterface *pEVar1;
  uint uVar2;
  long lVar3;
  Name NVar4;
  undefined1 local_58 [8];
  TableInstanceInfo info;
  
  getTableInstanceInfo((TableInstanceInfo *)local_58,this,(Name)*(string_view *)(curr + 0x10));
  NVar4.super_IString.str._M_str = (char *)info.instance;
  NVar4.super_IString.str._M_len = (size_t)((ModuleRunnerBase<wasm::ModuleRunner> *)local_58)->wasm;
  lVar3 = ::wasm::Module::getTable(NVar4);
  pEVar1 = ((ModuleRunnerBase<wasm::ModuleRunner> *)local_58)->externalInterface;
  uVar2 = (*pEVar1->_vptr_ExternalInterface[0x1b])
                    (pEVar1,*(undefined8 *)(curr + 0x10),*(undefined8 *)(curr + 0x18));
  __return_storage_ptr___00 = &info.name.super_IString.str._M_str;
  Literal::makeFromInt64
            ((Literal *)__return_storage_ptr___00,(ulong)uVar2,(Type)*(uintptr_t *)(lVar3 + 0x48));
  Flow::Flow(__return_storage_ptr__,(Literal *)__return_storage_ptr___00);
  ::wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableSize(TableSize* curr) {
    NOTE_ENTER("TableSize");
    auto info = getTableInstanceInfo(curr->table);
    auto* table = info.instance->wasm.getTable(info.name);
    Index tableSize = info.interface()->tableSize(curr->table);
    return Literal::makeFromInt64(tableSize, table->addressType);
  }